

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O1

void __thiscall
inja::Environment::Environment(Environment *this,string *input_path,string *output_path)

{
  pointer *__ptr;
  
  stdinja::make_unique<inja::Environment::Impl>();
  std::__cxx11::string::_M_assign
            ((string *)
             (this->m_impl)._M_t.
             super___uniq_ptr_impl<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>
             ._M_t.
             super__Tuple_impl<0UL,_inja::Environment::Impl_*,_std::default_delete<inja::Environment::Impl>_>
             .super__Head_base<0UL,_inja::Environment::Impl_*,_false>._M_head_impl);
  std::__cxx11::string::_M_assign
            ((string *)
             &((this->m_impl)._M_t.
               super___uniq_ptr_impl<inja::Environment::Impl,_std::default_delete<inja::Environment::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_inja::Environment::Impl_*,_std::default_delete<inja::Environment::Impl>_>
               .super__Head_base<0UL,_inja::Environment::Impl_*,_false>._M_head_impl)->output_path);
  return;
}

Assistant:

explicit Environment(const std::string& input_path, const std::string& output_path)
		: m_impl(stdinja::make_unique<Impl>()) {
		m_impl->input_path = input_path;
		m_impl->output_path = output_path;
	}